

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O0

void __thiscall Mapper004::writeHandler(Mapper004 *this,uint16_t addr,uint8_t value)

{
  Console *this_00;
  PPU *this_01;
  byte in_DL;
  ushort in_SI;
  Mapper004 *in_RDI;
  Console *c;
  
  if (((in_SI < 0x8000) || (0x9ffe < in_SI)) || ((uint)in_SI % 2 != 0)) {
    if (((in_SI < 0x8001) || (0x9fff < in_SI)) || ((uint)in_SI % 2 != 1)) {
      if (((in_SI < 0xa000) || (0xbffe < in_SI)) || ((uint)in_SI % 2 != 0)) {
        if (((in_SI < 0xa001) || (0xbfff < in_SI)) || ((uint)in_SI % 2 != 1)) {
          if (((in_SI < 0xc000) || (0xdffe < in_SI)) || ((uint)in_SI % 2 != 0)) {
            if (((in_SI < 0xc001) || (0xdfff < in_SI)) || ((uint)in_SI % 2 != 1)) {
              if (((in_SI < 0xe000) || (0xfffe < in_SI)) || ((uint)in_SI % 2 != 0)) {
                if ((0xe000 < in_SI) && ((uint)in_SI % 2 == 1)) {
                  in_RDI->irqEnabled = true;
                }
              }
              else {
                in_RDI->irqEnabled = false;
              }
            }
            else {
              in_RDI->counter = in_RDI->reloadVal;
            }
          }
          else {
            in_RDI->reloadVal = in_DL;
          }
        }
      }
      else {
        this_00 = Console::Instance();
        this_01 = Console::getPPU(this_00);
        PPU::setMirroring(this_01,in_DL & 1);
      }
    }
    else {
      in_RDI->regs[in_RDI->reg] = in_DL;
      switchBanks(in_RDI);
    }
  }
  else {
    in_RDI->rommode = (byte)((int)(uint)in_DL >> 6) & 1;
    in_RDI->vrommode = (uint8_t)((int)(uint)in_DL >> 7);
    in_RDI->reg = in_DL & 7;
    switchBanks(in_RDI);
  }
  return;
}

Assistant:

void Mapper004::writeHandler(uint16_t addr, uint8_t value) {
    if (addr >= 0x8000 && addr <= 0x9FFE && addr % 2 == 0) {
        rommode = ((value >> 6) & 1);
        vrommode = ((value >> 7) & 1);
        reg = value & 0x7;
        switchBanks();
    } else if (addr >= 0x8001 && addr <= 0x9FFF && addr % 2 == 1) {
        regs[reg] = value;
        switchBanks();
    } else if (addr >= 0xA000 && addr <= 0xBFFE && addr % 2 == 0) {
	Console &c = Console::Instance();
	c.getPPU()->setMirroring(value & 1);
    } else if (addr >= 0xA001 && addr <= 0xBFFF && addr % 2 == 1) {
        // ram protect(do we need this right now?)
    } else if (addr >= 0xC000 && addr <= 0xDFFE && addr % 2 == 0) {
        reloadVal = value;
    } else if (addr >= 0xC001 && addr <= 0xDFFF && addr % 2 == 1) {
        counter = reloadVal;
    } else if (addr >= 0xE000 && addr <= 0xFFFE && addr % 2 == 0) {
        irqEnabled = false;
    } else if (addr >= 0xE001 && addr <= 0xFFFF && addr % 2 == 1) {
        irqEnabled = true;
    }
}